

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

int CMinternal_listen(CManager_conflict cm,attr_list listen_info,int try_others)

{
  FILE *pFVar1;
  ulong uVar2;
  atom_t aVar3;
  int iVar4;
  __pid_t _Var5;
  pthread_t pVar6;
  CManager_conflict p_Var7;
  char *pcVar8;
  int in_EDX;
  attr_list in_RSI;
  undefined8 *in_RDI;
  bool bVar9;
  attr_list attrs;
  timespec ts_2;
  timespec ts_1;
  timespec ts;
  char *iface;
  char *chosen_transport;
  transport_entry_conflict *trans_list;
  int success;
  attr_list in_stack_ffffffffffffff48;
  CManager_conflict in_stack_ffffffffffffff50;
  long in_stack_ffffffffffffff88;
  CManager in_stack_ffffffffffffff90;
  CManager cm_00;
  timespec local_68;
  timespec local_58;
  timespec local_48;
  undefined1 local_38 [4];
  attr_list list;
  CManager in_stack_ffffffffffffffd8;
  long *plVar10;
  int local_20;
  attr_list local_18;
  
  local_20 = 0;
  list = (attr_list)0x0;
  _local_38 = (char *)0x0;
  local_18 = in_RSI;
  if (in_RSI != (attr_list)0x0) {
    attr_copy_list(in_RSI);
    local_18 = split_transport_attributes(list);
    get_string_attr(local_18,CM_TRANSPORT,&stack0xffffffffffffffd0);
    get_string_attr(local_18,CM_IP_INTERFACE,local_38);
  }
  if (list != (attr_list)0x0) {
    iVar4 = CMtrace_val[2];
    if (in_RDI[0x24] == 0) {
      iVar4 = CMtrace_init(in_stack_ffffffffffffff90,
                           (CMTraceType)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    }
    if (iVar4 != 0) {
      if (CMtrace_PID != 0) {
        pFVar1 = (FILE *)in_RDI[0x24];
        _Var5 = getpid();
        in_stack_ffffffffffffff88 = (long)_Var5;
        pVar6 = pthread_self();
        fprintf(pFVar1,"P%lxT%lx - ",in_stack_ffffffffffffff88,pVar6);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_48);
        fprintf((FILE *)in_RDI[0x24],"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
      }
      fprintf((FILE *)in_RDI[0x24],"CM - Listening only on transport \"%s\"\n",list);
    }
    fflush((FILE *)in_RDI[0x24]);
    pcVar8 = _local_38;
    uVar2 = (ulong)_local_38 >> 0x20;
    iVar4 = (int)uVar2;
    _local_38 = pcVar8;
    iVar4 = load_transport(in_stack_ffffffffffffffd8,(char *)list,iVar4);
    if (iVar4 == 0) {
      iVar4 = CMtrace_val[2];
      if (in_RDI[0x24] == 0) {
        iVar4 = CMtrace_init(in_stack_ffffffffffffff90,
                             (CMTraceType)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      }
      if (iVar4 != 0) {
        if (CMtrace_PID != 0) {
          pFVar1 = (FILE *)in_RDI[0x24];
          _Var5 = getpid();
          pVar6 = pthread_self();
          fprintf(pFVar1,"P%lxT%lx - ",(long)_Var5,pVar6);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_58);
          fprintf((FILE *)in_RDI[0x24],"%lld.%.9ld - ",local_58.tv_sec,local_58.tv_nsec);
        }
        fprintf((FILE *)in_RDI[0x24],"Failed to load transport \"%s\".  Revert to default.\n",list);
      }
      fflush((FILE *)in_RDI[0x24]);
      iVar4 = CMtrace_val[5];
      if (in_RDI[0x24] == 0) {
        iVar4 = CMtrace_init(in_stack_ffffffffffffff90,
                             (CMTraceType)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      }
      if (iVar4 != 0) {
        if (CMtrace_PID != 0) {
          pFVar1 = (FILE *)in_RDI[0x24];
          _Var5 = getpid();
          pVar6 = pthread_self();
          fprintf(pFVar1,"P%lxT%lx - ",(long)_Var5,pVar6);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_68);
          fprintf((FILE *)in_RDI[0x24],"%lld.%.9ld - ",local_68.tv_sec,local_68.tv_nsec);
        }
        fprintf((FILE *)in_RDI[0x24],"Failed to load transport \"%s\".  Revert to default.\n",list);
      }
      fflush((FILE *)in_RDI[0x24]);
      if (in_EDX == 0) {
        if (local_18 != (attr_list)0x0) {
          free_attr_list(local_18);
        }
        return 0;
      }
      list = (attr_list)0x0;
    }
  }
  plVar10 = (long *)*in_RDI;
  while( true ) {
    bVar9 = false;
    if (plVar10 != (long *)0x0) {
      bVar9 = *plVar10 != 0;
    }
    if (!bVar9) break;
    if ((list == (attr_list)0x0) || (iVar4 = strcmp(*(char **)*plVar10,(char *)list), iVar4 == 0)) {
      p_Var7 = (CManager_conflict)
               (**(code **)(*plVar10 + 0x30))(in_RDI,&CMstatic_trans_svcs,*plVar10,local_18);
      add_attr(p_Var7,CM_CMANAGER_ID,1,(long)*(int *)(in_RDI + 3));
      aVar3 = CM_IP_INTERFACE;
      cm_00 = p_Var7;
      if (_local_38 != (char *)0x0) {
        pcVar8 = strdup(_local_38);
        add_string_attr(p_Var7,aVar3,pcVar8);
        in_stack_ffffffffffffff50 = p_Var7;
      }
      add_contact_list(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      iVar4 = CMtrace_val[2];
      if (in_RDI[0x24] == 0) {
        iVar4 = CMtrace_init(cm_00,(CMTraceType)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      }
      if (iVar4 != 0) {
        fprintf((FILE *)in_RDI[0x24],"Adding contact list -> ");
        fdump_attr_list(in_RDI[0x24],cm_00);
      }
      if (cm_00 != (CManager)0x0) {
        local_20 = local_20 + 1;
      }
    }
    plVar10 = plVar10 + 1;
  }
  if (local_18 != (attr_list)0x0) {
    free_attr_list(local_18);
  }
  return local_20;
}

Assistant:

extern int
CMinternal_listen(CManager cm, attr_list listen_info, int try_others)
{
    int success = 0;
    transport_entry *trans_list;
    char *chosen_transport = NULL;
    char *iface = NULL;

    if (listen_info) {
        listen_info = split_transport_attributes(attr_copy_list(listen_info));
	get_string_attr(listen_info, CM_TRANSPORT, &chosen_transport);
	get_string_attr(listen_info, CM_IP_INTERFACE, &iface);
    }
    if (chosen_transport != NULL) {
        CMtrace_out(cm, CMConnectionVerbose,
		    "CM - Listening only on transport \"%s\"\n",
		    chosen_transport);
	if (load_transport(cm, chosen_transport, 1) == 0) {
	    CMtrace_out(cm, CMConnectionVerbose,
			"Failed to load transport \"%s\".  Revert to default.\n",
					chosen_transport);
	    CMtrace_out(cm, CMTransportVerbose,
			"Failed to load transport \"%s\".  Revert to default.\n",
			chosen_transport);
	    if (!try_others) {
		if (listen_info) free_attr_list(listen_info);
		return success;
	    }
	    chosen_transport = NULL;
	}
    }
    trans_list = cm->transports;
    while ((trans_list != NULL) && (*trans_list != NULL)) {
	attr_list attrs;
	if ((chosen_transport == NULL) || 
	    (strcmp((*trans_list)->trans_name, chosen_transport) == 0)) {
	    attrs = (*trans_list)->listen(cm, &CMstatic_trans_svcs,
					  *trans_list,
					  listen_info);
	    add_attr(attrs, CM_CMANAGER_ID, Attr_Int4, (intptr_t)cm->CManager_ID);
	    if (iface) {
		add_string_attr(attrs, CM_IP_INTERFACE, strdup(iface));
	    }
	    add_contact_list(cm, attrs);
	    if (CMtrace_on(cm, CMConnectionVerbose)) {
		fprintf(cm->CMTrace_file, "Adding contact list -> ");
		fdump_attr_list(cm->CMTrace_file, attrs);
	    }
	    if (attrs != NULL) {
		success++;
	    }
	}
	trans_list++;
    }
    if (listen_info) free_attr_list(listen_info);
    return success;
}